

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateBuilderParsingMethods
          (MessageBuilderGenerator *this,Printer *printer)

{
  string local_30;
  
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_30,this->name_resolver_,this->descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "@java.lang.Override\npublic Builder mergeFrom(\n    com.google.protobuf.CodedInputStream input,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws java.io.IOException {\n  $classname$ parsedMessage = null;\n  try {\n    parsedMessage = PARSER.parsePartialFrom(input, extensionRegistry);\n  } catch (com.google.protobuf.InvalidProtocolBufferException e) {\n    parsedMessage = ($classname$) e.getUnfinishedMessage();\n    throw e.unwrapIOException();\n  } finally {\n    if (parsedMessage != null) {\n      mergeFrom(parsedMessage);\n    }\n  }\n  return this;\n}\n"
             ,(char (*) [10])0x3dd2a7,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void MessageBuilderGenerator::GenerateBuilderParsingMethods(
    io::Printer* printer) {
  printer->Print(
      "@java.lang.Override\n"
      "public Builder mergeFrom(\n"
      "    com.google.protobuf.CodedInputStream input,\n"
      "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
      "    throws java.io.IOException {\n"
      "  $classname$ parsedMessage = null;\n"
      "  try {\n"
      "    parsedMessage = PARSER.parsePartialFrom(input, extensionRegistry);\n"
      "  } catch (com.google.protobuf.InvalidProtocolBufferException e) {\n"
      "    parsedMessage = ($classname$) e.getUnfinishedMessage();\n"
      "    throw e.unwrapIOException();\n"
      "  } finally {\n"
      "    if (parsedMessage != null) {\n"
      "      mergeFrom(parsedMessage);\n"
      "    }\n"
      "  }\n"
      "  return this;\n"
      "}\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));
}